

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborarray.cpp
# Opt level: O2

void __thiscall QCborArray::removeAt(QCborArray *this,qsizetype i)

{
  QCborContainerPrivate *pQVar1;
  qsizetype reserved;
  
  pQVar1 = (this->d).d.ptr;
  if (pQVar1 == (QCborContainerPrivate *)0x0) {
    reserved = 0;
  }
  else {
    reserved = (pQVar1->elements).d.size;
  }
  detach(this,reserved);
  QCborContainerPrivate::removeAt((this->d).d.ptr,i);
  return;
}

Assistant:

void QCborArray::removeAt(qsizetype i)
{
    detach(size());
    d->removeAt(i);
}